

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.h
# Opt level: O0

void __thiscall CVmNetFile::abandon(CVmNetFile *this)

{
  CVmNetFile *in_RDI;
  
  if (in_RDI->srvfname != (char *)0x0) {
    remove(in_RDI->lclfname);
  }
  if (in_RDI != (CVmNetFile *)0x0) {
    ~CVmNetFile(in_RDI);
    operator_delete(in_RDI,0x30);
  }
  return;
}

Assistant:

void abandon(VMG0_)
    {
#ifdef TADSNET
        /* delete the temp file */
        if (srvfname != 0)
            osfdel(lclfname);
#endif

        /* free self */
        delete this;
    }